

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser * init_parse_artifact(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_artifact_name);
  parser_reg(p,"base-object sym tval ?sym sval",parse_artifact_base_object);
  parser_reg(p,"graphics char glyph sym color",parse_artifact_graphics);
  parser_reg(p,"level int level",parse_artifact_level);
  parser_reg(p,"weight int weight",parse_artifact_weight);
  parser_reg(p,"cost int cost",parse_artifact_cost);
  parser_reg(p,"alloc int common str minmax",parse_artifact_alloc);
  parser_reg(p,"attack rand hd int to-h int to-d",parse_artifact_attack);
  parser_reg(p,"armor int ac int to-a",parse_artifact_armor);
  parser_reg(p,"charges rand charges",parse_artifact_charges);
  parser_reg(p,"flags ?str flags",parse_artifact_flags);
  parser_reg(p,"act str name",parse_artifact_act);
  parser_reg(p,"effect sym eff ?sym type ?int radius ?int other",parse_artifact_effect);
  parser_reg(p,"effect-yx int y int x",parse_artifact_effect_yx);
  parser_reg(p,"dice str dice",parse_artifact_dice);
  parser_reg(p,"expr sym name sym base str expr",parse_artifact_expr);
  parser_reg(p,"time rand time",parse_artifact_time);
  parser_reg(p,"msg str text",parse_artifact_msg);
  parser_reg(p,"values str values",parse_artifact_values);
  parser_reg(p,"desc str text",parse_artifact_desc);
  parser_reg(p,"slay str code",parse_artifact_slay);
  parser_reg(p,"brand str code",parse_artifact_brand);
  parser_reg(p,"curse sym name int power",parse_artifact_curse);
  return p;
}

Assistant:

struct parser *init_parse_artifact(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_artifact_name);
	parser_reg(p, "base-object sym tval ?sym sval", parse_artifact_base_object);
	parser_reg(p, "graphics char glyph sym color", parse_artifact_graphics);
	parser_reg(p, "level int level", parse_artifact_level);
	parser_reg(p, "weight int weight", parse_artifact_weight);
	parser_reg(p, "cost int cost", parse_artifact_cost);
	parser_reg(p, "alloc int common str minmax", parse_artifact_alloc);
	parser_reg(p, "attack rand hd int to-h int to-d", parse_artifact_attack);
	parser_reg(p, "armor int ac int to-a", parse_artifact_armor);
	parser_reg(p, "charges rand charges", parse_artifact_charges);
	parser_reg(p, "flags ?str flags", parse_artifact_flags);
	parser_reg(p, "act str name", parse_artifact_act);
	parser_reg(p, "effect sym eff ?sym type ?int radius ?int other",
			   parse_artifact_effect);
	parser_reg(p, "effect-yx int y int x", parse_artifact_effect_yx);
	parser_reg(p, "dice str dice", parse_artifact_dice);
	parser_reg(p, "expr sym name sym base str expr", parse_artifact_expr);
	parser_reg(p, "time rand time", parse_artifact_time);
	parser_reg(p, "msg str text", parse_artifact_msg);
	parser_reg(p, "values str values", parse_artifact_values);
	parser_reg(p, "desc str text", parse_artifact_desc);
	parser_reg(p, "slay str code", parse_artifact_slay);
	parser_reg(p, "brand str code", parse_artifact_brand);
	parser_reg(p, "curse sym name int power", parse_artifact_curse);
	return p;
}